

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

void MIR_finish_func(MIR_context_t ctx)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  MIR_type_t MVar4;
  MIR_item_t_conflict func_item;
  long lVar5;
  MIR_error_func_t p_Var6;
  undefined8 uVar7;
  longdouble lVar8;
  bool bVar9;
  undefined1 auVar10 [48];
  bool bVar11;
  bool bVar12;
  undefined8 *puVar13;
  undefined1 *puVar14;
  char cVar15;
  char cVar16;
  MIR_op_mode_t MVar17;
  ulong uVar18;
  reg_desc_t *prVar19;
  MIR_op_t *ops;
  MIR_insn_t_conflict pMVar20;
  MIR_func_t pMVar21;
  MIR_insn_t pMVar22;
  char *pcVar23;
  char *pcVar24;
  size_t i;
  MIR_context_t pMVar25;
  ulong uVar26;
  undefined8 *puVar27;
  undefined8 *puVar28;
  undefined1 *puVar29;
  undefined8 *puVar30;
  undefined8 *puVar31;
  undefined1 *puVar32;
  undefined8 *puVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  ulong unaff_RBP;
  ulong in_RSI;
  char *pcVar37;
  char *pcVar38;
  MIR_op_mode_t MVar39;
  code *unaff_R12;
  uint uVar40;
  ulong unaff_R13;
  MIR_op_mode_t MVar41;
  code *pcVar42;
  DLIST_MIR_insn_t *pDVar43;
  undefined8 uStackY_d0;
  int out_p;
  uint uStack_64;
  undefined2 uStack_60;
  undefined6 uStack_5e;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined2 uStack_50;
  undefined6 uStack_4e;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  puVar31 = (undefined8 *)&stack0xffffffffffffff38;
  puVar32 = &stack0xffffffffffffff38;
  puVar36 = &stack0xffffffffffffff38;
  puVar34 = &stack0xffffffffffffff38;
  puVar35 = &stack0xffffffffffffff38;
  puVar29 = &stack0xffffffffffffff38;
  puVar28 = (undefined8 *)&stack0xffffffffffffff38;
  pMVar21 = ctx->curr_func;
  if (pMVar21 == (MIR_func_t)0x0) {
LAB_00111eee:
    pcVar23 = "finish of non-existing function";
    puVar33 = &uStackY_d0;
    uStackY_d0 = 7;
    pMVar25 = ctx;
    goto LAB_00111db8;
  }
  if (((pMVar21->vararg_p != '\0') || (pMVar21->nargs != 0)) ||
     (cVar15 = '\x01', pMVar21->nres != 1)) {
    cVar15 = '\0';
  }
  pcVar23 = pMVar21->name;
  bVar11 = false;
  bVar12 = false;
  pDVar43 = &pMVar21->insns;
  while (pMVar20 = pDVar43->head, pMVar20 != (MIR_insn_t_conflict)0x0) {
    unaff_R13 = *(ulong *)&pMVar20->field_0x18;
    uVar40 = (uint)unaff_R13;
    uStackY_d0 = 1;
    if (uVar40 == 0xab) {
      bVar11 = true;
    }
    if (uVar40 == 0xac) {
      bVar12 = true;
    }
    pMVar25 = ctx;
    if (uVar40 - 0xb9 < 2) goto LAB_00111d96;
    pMVar21 = ctx->curr_func;
    if ((uVar40 == 0xb2) && (pMVar21->vararg_p == '\0')) {
      ctx->curr_func = (MIR_func_t)0x0;
      pcVar23 = "va_start is not in vararg function";
      goto LAB_00111db6;
    }
    if ((uVar40 == 0xac) && (pMVar21->nres != 0)) goto LAB_00111e59;
    puVar13 = (undefined8 *)&stack0xffffffffffffff38;
    if (uVar40 == 0xac && bVar11) goto LAB_00111dbe;
    puVar13 = (undefined8 *)&stack0xffffffffffffff38;
    if (uVar40 == 0xab && bVar12) goto LAB_00111dbe;
    unaff_R12 = (code *)(unaff_R13 >> 0x20);
    if (uVar40 == 0xab) {
      uVar26 = CONCAT71((int7)(in_RSI >> 8),1);
      puVar14 = &stack0xffffffffffffff38;
      cVar16 = cVar15;
      if ((uint32_t)(unaff_R13 >> 0x20) != pMVar21->nres) goto LAB_00111e2b;
    }
    else {
      uVar26 = 0;
      cVar16 = '\0';
      if ((uVar40 - 0xaa < 0xfffffffd) &&
         (uVar26 = 1, pMVar22 = pMVar20, cVar16 = cVar15, uVar40 - 0xa1 < 4)) {
        do {
          pMVar22 = (pMVar22->insn_link).prev;
          if (pMVar22 == (MIR_insn_t)0x0) goto LAB_00111c86;
          uVar3 = *(uint *)&pMVar22->field_0x18;
          uVar18 = (ulong)uVar3;
        } while ((uVar18 == 0) && (*(char *)&pMVar22[1].insn_link.prev == '\x01'));
        if (uVar3 - 0x76 < 0xfffffff8) {
LAB_00111c86:
          pcVar37 = 
          "func %s: instruction \'%s\' has no previous overflow insn separated only by stores and reg moves"
          ;
          pcVar23 = insn_descs[unaff_R13 & 0xffffffff].name;
          puVar27 = &uStackY_d0;
          uStackY_d0 = 0x1c;
          goto LAB_00111ca2;
        }
        if ((((char)unaff_R13 == -0x5e) || ((uVar40 & 0xff) == 0xa4)) && ((uVar3 & 0x7e) == 0x72)) {
          unaff_R13 = (ulong)(uVar40 & 0xa6);
          pcVar38 = 
          "func %s: unsigned overflow branch \'%s\' consumes flag of signed overflow insn \'%s\'";
          pcVar37 = insn_descs[uVar18].name;
          pcVar24 = insn_descs[unaff_R13].name;
        }
        else {
          if (((uVar40 & 0xa5) != 0xa1) || ((uVar3 & 0x7e) != 0x74)) goto LAB_001116fb;
          pcVar38 = 
          "func %s: signed overflow branch \'%s\' consumes flag of unsigned overflow insn \'%s\'";
          pcVar24 = insn_descs[unaff_R13 & 0xffffffff].name;
          pcVar37 = insn_descs[uVar18].name;
        }
        uStackY_d0 = 0x111eee;
        (*ctx->error_func)(MIR_invalid_insn_error,pcVar38,pcVar23,pcVar24,pcVar37);
        goto LAB_00111eee;
      }
    }
LAB_001116fb:
    pMVar25 = (MIR_context_t)&pMVar20->ops[0].field_0x8;
    unaff_R12 = (code *)-(long)unaff_R12;
    uStackY_d0 = 1;
    in_RSI = uVar26;
    cVar15 = cVar16;
    for (unaff_RBP = 1; unaff_R12 + unaff_RBP != (code *)0x1; unaff_RBP = unaff_RBP + 1) {
      if (unaff_RBP == 1 && uVar40 == 0xb5) {
        if (pMVar20->ops[0].field_0x8 != '\x03') {
          uStackY_d0 = 0x111b9e;
          __assert_fail("insn->ops[i].mode == MIR_OP_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x642,"void MIR_finish_func(MIR_context_t)");
        }
      }
      else if ((char)in_RSI == '\0') {
        if (unaff_RBP != 1) {
          if (unaff_RBP != 2) goto LAB_0011176d;
          if (*(char *)&pMVar20[1].insn_link.prev == '\b') {
            uVar3 = *(uint *)&(pMVar20[1].insn_link.next)->ops[0].data;
            if ((4 < uVar3) || (uVar3 == 1)) {
              uStackY_d0 = 0x111e95;
              __assert_fail("insn->ops[i].u.ref->item_type == MIR_import_item || insn->ops[i].u.ref->item_type == MIR_export_item || insn->ops[i].u.ref->item_type == MIR_forward_item || insn->ops[i].u.ref->item_type == MIR_func_item"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x64d,"void MIR_finish_func(MIR_context_t)");
            }
            goto LAB_00111a00;
          }
          goto LAB_001117e4;
        }
        if ((pMVar20->ops[0].field_0x8 != '\b') ||
           ((pMVar20->ops[0].u.ref)->item_type != MIR_proto_item)) {
          uStackY_d0 = 0x111bbd;
          __assert_fail("insn->ops[i].mode == MIR_OP_REF && insn->ops[i].u.ref->item_type == MIR_proto_item"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x647,"void MIR_finish_func(MIR_context_t)");
        }
      }
      else {
LAB_0011176d:
        if (unaff_RBP == 3 && uVar40 == 0xb0) {
          if (*(char *)((long)&pMVar20[1].ops[0].u + 8) != '\n') {
            uStackY_d0 = 0x111c0a;
            __assert_fail("insn->ops[i].mode == MIR_OP_MEM",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x652,"void MIR_finish_func(MIR_context_t)");
          }
        }
        else {
LAB_001117e4:
          if (uVar40 == 0xaa) {
            _out_p = (ulong)uStack_64 << 0x20;
            pcVar42 = (code *)((ulong)(unaff_RBP != 1) * 9 + 3);
          }
          else {
            if (uVar40 == 0xab) {
              _out_p = (ulong)uStack_64 << 0x20;
              uStackY_d0 = 0x111829;
              MVar17 = type2mode(ctx->curr_func->res_types[unaff_RBP - 1]);
            }
            else {
              uStackY_d0 = 0x111841;
              MVar17 = MIR_insn_op_mode(ctx,pMVar20,unaff_RBP - 1,&out_p);
            }
            pcVar42 = (code *)(ulong)MVar17;
          }
          uVar2 = *(ushort *)&pMVar25->gen_ctx;
          cVar16 = (char)uVar2;
          if (cVar16 == '\x01') {
            uStackY_d0 = 0x111895;
            prVar19 = find_rd_by_reg(ctx,((anon_union_32_12_57d33f68_for_u *)&pMVar25->c2mir_ctx)->
                                         reg,ctx->curr_func);
            if ((prVar19 == (reg_desc_t *)0x0) ||
               (((anon_union_32_12_57d33f68_for_u *)&pMVar25->c2mir_ctx)->reg != prVar19->reg)) {
              uStackY_d0 = 0x111c48;
              __assert_fail("rd != ((void*)0) && insn->ops[i].u.reg == rd->reg",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x662,"void MIR_finish_func(MIR_context_t)");
            }
            uStackY_d0 = 0x1118b1;
            MVar17 = type2mode(prVar19->type);
            bVar9 = true;
          }
          else if (cVar16 == '\n') {
            if (0xb < *(byte *)&pMVar25->c2mir_ctx) {
              if ((~(byte)uVar26 & 0xfffffff9 < *(byte *)&pMVar25->c2mir_ctx - 0x12) == 0)
              goto LAB_00111dda;
              if ((long)pMVar25->insn_nops < 0) {
                pcVar23 = "func %s: in instruction \'%s\': block type memory with disp < 0";
                goto LAB_00111e10;
              }
            }
            if (pMVar25->func_redef_permission_p != 0) {
              uStackY_d0 = 0x1118fb;
              prVar19 = find_rd_by_reg(ctx,pMVar25->func_redef_permission_p,ctx->curr_func);
              if ((prVar19 == (reg_desc_t *)0x0) ||
                 (pMVar25->func_redef_permission_p != prVar19->reg)) {
                uStackY_d0 = 0x111c86;
                __assert_fail("rd != ((void*)0) && insn->ops[i].u.mem.base == rd->reg",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                              ,0x676,"void MIR_finish_func(MIR_context_t)");
              }
              uStackY_d0 = 0x111917;
              MVar17 = type2mode(prVar19->type);
              puVar13 = (undefined8 *)&stack0xffffffffffffff38;
              if (MVar17 != MIR_OP_INT) goto LAB_00111d42;
            }
            if (*(MIR_reg_t *)&pMVar25->field_0x1c != 0) {
              uStackY_d0 = 0x111938;
              prVar19 = find_rd_by_reg(ctx,*(MIR_reg_t *)&pMVar25->field_0x1c,ctx->curr_func);
              if ((prVar19 == (reg_desc_t *)0x0) ||
                 (*(MIR_reg_t *)&pMVar25->field_0x1c != prVar19->reg)) {
                uStackY_d0 = 0x111c67;
                __assert_fail("rd != ((void*)0) && insn->ops[i].u.mem.index == rd->reg",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                              ,0x682,"void MIR_finish_func(MIR_context_t)");
              }
              uStackY_d0 = 0x111954;
              MVar17 = type2mode(prVar19->type);
              if (MVar17 != MIR_OP_INT) {
                pcVar23 = 
                "func %s: in instruction \'%s\': index reg of non-integer type for operand #%d";
                goto LAB_00111d78;
              }
            }
            uStackY_d0 = 0x111966;
            MVar17 = type2mode((uint)*(byte *)&pMVar25->c2mir_ctx);
            bVar9 = true;
            cVar15 = '\0';
          }
          else {
            if ((cVar16 == '\x02') || (cVar16 == '\v')) {
              uStackY_d0 = 0x111c29;
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x692,"void MIR_finish_func(MIR_context_t)");
            }
            uStackY_d0 = 3;
            MVar17 = (uint)(uVar2 & 0xff);
            if ((uVar2 & 0xfe) == 8) {
              MVar17 = MIR_OP_INT;
            }
            bVar9 = false;
          }
          bVar1 = *(byte *)&pMVar25->gen_ctx;
          MVar39 = (MIR_op_mode_t)bVar1;
          *(ushort *)&pMVar25->gen_ctx = (ushort)(MVar17 << 8) | (ushort)bVar1;
          MVar41 = (MIR_op_mode_t)pcVar42;
          if (((MVar17 == MIR_OP_UNDEF) && (bVar1 == 10)) &&
             ((uVar40 == 0xb2 && unaff_RBP == 1 ||
              (unaff_RBP == 2 && (uVar40 == 0xb3 || (uVar40 & 0xfffffffe) == 0xb0))))) {
            *(ushort *)&pMVar25->gen_ctx = (ushort)(MVar41 << 8) | 10;
          }
          else if ((char)pcVar42 != '\0') {
            if ((MVar41 & 0xff) == MIR_OP_REG) {
              puVar13 = (undefined8 *)&stack0xffffffffffffff38;
              if (1 < (ushort)(bVar1 - 1)) goto LAB_00111cad;
            }
            else {
              uStackY_d0 = 3;
              MVar39 = MVar17;
              if (MVar17 == MIR_OP_UINT) {
                MVar39 = MIR_OP_INT;
              }
              if (MVar39 != MVar41) goto LAB_00111ceb;
            }
          }
          in_RSI = uVar26 & 0xffffffff;
          if (!bVar9 && out_p != 0) {
            pcVar23 = "func %s; in instruction \'%s\': wrong operand #%d for insn output";
            ctx->curr_func = (MIR_func_t)0x0;
            pcVar37 = insn_descs[unaff_R13 & 0xffffffff].name;
            puVar30 = &uStackY_d0;
            uStackY_d0 = 0x1b;
            do {
              uVar7 = *puVar30;
              puVar31 = puVar30 + 1;
              p_Var6 = ctx->error_func;
              *puVar30 = 0x111d96;
              (*p_Var6)((MIR_error_type_t)uVar7,pcVar23,puVar30[10],pcVar37,unaff_RBP);
LAB_00111d96:
              pMVar25->curr_func = (MIR_func_t)0x0;
              pcVar23 = "use or phi can be used only internally";
              ctx = pMVar25;
              puVar32 = (undefined1 *)puVar31;
LAB_00111db6:
              puVar33 = (undefined8 *)(puVar32 + -8);
              *(undefined8 *)(puVar32 + -8) = 9;
              pMVar25 = ctx;
LAB_00111db8:
              uVar7 = *puVar33;
              p_Var6 = pMVar25->error_func;
              *puVar33 = 0x111dbe;
              (*p_Var6)((MIR_error_type_t)uVar7,pcVar23);
              puVar13 = puVar33 + 1;
LAB_00111dbe:
              puVar34 = (undefined1 *)puVar13;
              pMVar25->curr_func = (MIR_func_t)0x0;
              *(undefined8 *)(puVar34 + -8) = 9;
              uVar7 = *(undefined8 *)(puVar34 + -8);
              p_Var6 = pMVar25->error_func;
              *(undefined8 *)(puVar34 + -8) = 0x111dda;
              (*p_Var6)((MIR_error_type_t)uVar7,"func %s: mix of RET and JRET insns",
                        *(undefined8 *)(puVar34 + 0x48));
LAB_00111dda:
              ctx = *(MIR_context_t *)(puVar34 + 0x38);
              pcVar23 = "func %s: in instruction \'%s\': wrong type memory";
              puVar35 = puVar34;
LAB_00111e10:
              ctx->curr_func = (MIR_func_t)0x0;
              pcVar37 = insn_descs[unaff_R13 & 0xffffffff].name;
              *(undefined8 *)(puVar35 + -8) = 0x12;
              uVar7 = *(undefined8 *)(puVar35 + -8);
              p_Var6 = ctx->error_func;
              *(undefined8 *)(puVar35 + -8) = 0x111e2b;
              (*p_Var6)((MIR_error_type_t)uVar7,pcVar23,*(undefined8 *)(puVar35 + 0x48),pcVar37);
              ctx = pMVar25;
              puVar14 = puVar35;
LAB_00111e2b:
              puVar36 = puVar14;
              ctx->curr_func = (MIR_func_t)0x0;
              *(undefined8 *)(puVar36 + -8) = 9;
              uVar7 = *(undefined8 *)(puVar36 + -8);
              p_Var6 = ctx->error_func;
              *(undefined8 *)(puVar36 + -8) = 0x111e59;
              (*p_Var6)((MIR_error_type_t)uVar7,
                        "func %s: in instruction \'%s\': number of operands in return does not correspond number of function returns. Expected %d, got %d"
                        ,*(undefined8 *)(puVar36 + 0x48),"ret",(ulong)_DAT_00000038,unaff_R12);
LAB_00111e59:
              ctx->curr_func = (MIR_func_t)0x0;
              pcVar37 = "func %s: in insn \'%s\': function should not have results in this case";
              pcVar23 = "jret";
              puVar27 = (undefined8 *)(puVar36 + -8);
              *(undefined8 *)(puVar36 + -8) = 9;
LAB_00111ca2:
              uVar7 = *puVar27;
              p_Var6 = ctx->error_func;
              *puVar27 = 0x111cad;
              MVar39 = (MIR_op_mode_t)uVar7;
              (*p_Var6)(MVar39,pcVar37,puVar27[10],pcVar23);
              puVar13 = puVar27 + 1;
LAB_00111cad:
              puVar28 = puVar13;
              pcVar42 = *(code **)(*(long *)((long)puVar28 + 0x38) + 0x10);
              pcVar23 = insn_descs[unaff_R13 & 0xffffffff].name;
              *(undefined8 *)((long)puVar28 + -8) = 0x111cce;
              pcVar37 = mode_str(MVar39);
              *(undefined8 *)((long)puVar28 + -8) = 0x1a;
              uVar7 = *(undefined8 *)((long)puVar28 + -8);
              *(undefined8 *)((long)puVar28 + -8) = 0x111ceb;
              MVar17 = (*pcVar42)(uVar7,
                                  "func %s: in instruction \'%s\': expected reg for operand #%d. Got \'%s\'"
                                  ,*(undefined8 *)((long)puVar28 + 0x48),pcVar23,unaff_RBP,pcVar37);
LAB_00111ceb:
              lVar5 = puVar28[7];
              *(undefined8 *)(lVar5 + 0x90) = 0;
              unaff_R12 = *(code **)(lVar5 + 0x10);
              pMVar25 = (MIR_context_t)insn_descs[unaff_R13 & 0xffffffff].name;
              puVar28[-1] = 0x111d16;
              pcVar23 = mode_str(MVar17);
              puVar28[-1] = 0x111d21;
              pcVar37 = mode_str((MIR_op_mode_t)pcVar42);
              *puVar28 = pcVar37;
              puVar28[-1] = 0x1a;
              uVar7 = puVar28[-1];
              puVar28[-1] = 0x111d42;
              (*unaff_R12)(uVar7,
                           "func %s: in instruction \'%s\': unexpected operand mode for operand #%d. Got \'%s\', expected \'%s\'"
                           ,puVar28[9],pMVar25,unaff_RBP,pcVar23);
              puVar13 = puVar28;
LAB_00111d42:
              puVar29 = (undefined1 *)puVar13;
              ctx = *(MIR_context_t *)(puVar29 + 0x38);
              pcVar23 = 
              "func %s: in instruction \'%s\': base reg of non-integer type for operand #%d";
LAB_00111d78:
              ctx->curr_func = (MIR_func_t)0x0;
              pcVar37 = insn_descs[unaff_R13 & 0xffffffff].name;
              puVar30 = (undefined8 *)(puVar29 + -8);
              *(undefined8 *)(puVar29 + -8) = 0x11;
            } while( true );
          }
        }
      }
LAB_00111a00:
      pMVar25 = (MIR_context_t)&pMVar25->temp_string;
    }
    pDVar43 = (DLIST_MIR_insn_t *)&(pMVar20->insn_link).next;
  }
  pMVar21 = ctx->curr_func;
  if ((!bVar11 && !bVar12) &&
     ((pMVar20 = (pMVar21->insns).tail, pMVar20 == (MIR_insn_t_conflict)0x0 ||
      (*(int *)&pMVar20->field_0x18 != 0x76)))) {
    uStackY_d0 = 0x111a58;
    VARR_MIR_op_ttrunc(ctx->temp_ops,in_RSI);
    uVar26 = 0;
    while( true ) {
      pMVar21 = ctx->curr_func;
      uVar40 = pMVar21->nres;
      if (uVar40 <= uVar26) break;
      MVar4 = pMVar21->res_types[uVar26];
      _out_p = 0;
      if (MVar4 == MIR_T_LD) {
        uVar40 = (uint)unaff_RBP & 0xffffff00 | 7;
        unaff_RBP = (ulong)uVar40;
        uStack_60 = (undefined2)uVar40;
        lVar8 = (longdouble)0;
        uStack_58 = SUB104(lVar8,0);
        uStack_54 = (undefined4)((unkuint10)lVar8 >> 0x20);
        uStack_50 = (undefined2)((unkuint10)lVar8 >> 0x40);
      }
      else {
        if (MVar4 == MIR_T_D) {
          uStack_60 = 6;
        }
        else {
          if (MVar4 == MIR_T_F) {
            uVar40 = (uint)unaff_R13 & 0xffffff00 | 5;
            unaff_R13 = (ulong)uVar40;
            uStack_60 = (undefined2)uVar40;
            uStack_58 = 0;
            goto LAB_00111ae5;
          }
          uVar40 = (uint)unaff_R12 & 0xffffff00 | 3;
          unaff_R12 = (code *)(ulong)uVar40;
          uStack_60 = (undefined2)uVar40;
        }
        uStack_58 = 0;
        uStack_54 = 0;
      }
LAB_00111ae5:
      auVar10._2_6_ = uStack_5e;
      auVar10._0_2_ = uStack_60;
      auVar10._12_4_ = uStack_54;
      auVar10._8_4_ = uStack_58;
      auVar10._18_6_ = uStack_4e;
      auVar10._16_2_ = uStack_50;
      uStackY_d0 = 0x111b10;
      auVar10._24_8_ = uStack_48;
      auVar10._32_8_ = uStack_40;
      auVar10._40_8_ = 0;
      VARR_MIR_op_tpush(ctx->temp_ops,(MIR_op_t)(auVar10 << 0x40));
      uVar26 = uVar26 + 1;
    }
    func_item = pMVar21->func_item;
    uStackY_d0 = 0x111b2d;
    ops = VARR_MIR_op_taddr(ctx->temp_ops);
    uStackY_d0 = 0x111b40;
    pMVar20 = MIR_new_insn_arr(ctx,MIR_RET,(ulong)uVar40,ops);
    uStackY_d0 = 0x111b4e;
    MIR_append_insn(ctx,func_item,pMVar20);
    pMVar21 = ctx->curr_func;
  }
  pMVar21->expr_p = cVar15;
  pMVar21->jret_p = bVar12;
  ctx->curr_func = (MIR_func_t)0x0;
  return;
}

Assistant:

void MIR_finish_func (MIR_context_t ctx) {
  int expr_p = TRUE;
  MIR_insn_t insn, prev_insn;
  MIR_insn_code_t code;
  const char *func_name;
  int ret_p = FALSE, jret_p = FALSE;

  if (curr_func == NULL)
    MIR_get_error_func (ctx) (MIR_no_func_error, "finish of non-existing function");
  func_name = curr_func->name;
  if (curr_func->vararg_p || curr_func->nargs != 0 || curr_func->nres != 1) expr_p = FALSE;
  for (insn = DLIST_HEAD (MIR_insn_t, curr_func->insns); insn != NULL;
       insn = DLIST_NEXT (MIR_insn_t, insn)) {
    size_t i, actual_nops = MIR_insn_nops (ctx, insn);
    MIR_op_mode_t mode, expected_mode;
    reg_desc_t *rd;
    int out_p, can_be_out_p;

    code = insn->code;
    if (code == MIR_RET) ret_p = TRUE;
    if (code == MIR_JRET) jret_p = TRUE;
    if (code == MIR_PHI || code == MIR_USE) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "use or phi can be used only internally");
    } else if (!curr_func->vararg_p && code == MIR_VA_START) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "va_start is not in vararg function");
    } else if (code == MIR_JRET && curr_func->nres != 0) {
      curr_func = NULL;
      MIR_get_error_func (
        ctx) (MIR_vararg_func_error,
              "func %s: in insn '%s': function should not have results in this case", func_name,
              insn_descs[code].name);
    } else if ((code == MIR_JRET && ret_p) || (code == MIR_RET && jret_p)) {
      curr_func = NULL;
      MIR_get_error_func (ctx) (MIR_vararg_func_error, "func %s: mix of RET and JRET insns",
                                func_name);
    } else if (code == MIR_RET && actual_nops != curr_func->nres) {
      curr_func = NULL;
      MIR_get_error_func (
        ctx) (MIR_vararg_func_error,
              "func %s: in instruction '%s': number of operands in return does not "
              "correspond number of function returns. Expected %d, got %d",
              func_name, insn_descs[code].name, curr_func->nres, actual_nops);
    } else if (MIR_call_code_p (code)) {
      expr_p = FALSE;
    } else if (code == MIR_BO || code == MIR_UBO || code == MIR_BNO || code == MIR_UBNO) {
      for (prev_insn = DLIST_PREV (MIR_insn_t, insn); prev_insn != NULL;
           prev_insn = DLIST_PREV (MIR_insn_t, prev_insn))
        if (prev_insn->code != MIR_MOV || prev_insn->ops[1].mode != MIR_OP_REG) break;
      if (prev_insn == NULL || !MIR_overflow_insn_code_p (prev_insn->code))
        MIR_get_error_func (ctx) (MIR_invalid_insn_error,
                                  "func %s: instruction '%s' has no previous overflow insn "
                                  "separated only by stores and reg moves",
                                  func_name, insn_descs[code].name);
      else if ((code == MIR_UBO || code == MIR_UBNO)
               && (prev_insn->code == MIR_MULO || prev_insn->code == MIR_MULOS))
        MIR_get_error_func (
          ctx) (MIR_invalid_insn_error,
                "func %s: unsigned overflow branch '%s' consumes flag of signed overflow insn '%s'",
                func_name, insn_descs[code].name, insn_descs[prev_insn->code].name);
      else if ((code == MIR_BO || code == MIR_BNO)
               && (prev_insn->code == MIR_UMULO || prev_insn->code == MIR_UMULOS))
        MIR_get_error_func (
          ctx) (MIR_invalid_insn_error,
                "func %s: signed overflow branch '%s' consumes flag of unsigned overflow insn '%s'",
                func_name, insn_descs[code].name, insn_descs[prev_insn->code].name);
    }
    for (i = 0; i < actual_nops; i++) {
      if (code == MIR_UNSPEC && i == 0) {
        mir_assert (insn->ops[i].mode == MIR_OP_INT);
        continue;
      } else if (MIR_call_code_p (code)) {
        if (i == 0) {
          mir_assert (insn->ops[i].mode == MIR_OP_REF
                      && insn->ops[i].u.ref->item_type == MIR_proto_item);
          continue; /* We checked the operand during insn creation -- skip the prototype */
        } else if (i == 1 && insn->ops[i].mode == MIR_OP_REF) {
          mir_assert (insn->ops[i].u.ref->item_type == MIR_import_item
                      || insn->ops[i].u.ref->item_type == MIR_export_item
                      || insn->ops[i].u.ref->item_type == MIR_forward_item
                      || insn->ops[i].u.ref->item_type == MIR_func_item);
          continue; /* We checked the operand during insn creation -- skip the func */
        }
      }
      if (code == MIR_VA_ARG && i == 2) {
        mir_assert (insn->ops[i].mode == MIR_OP_MEM);
        continue; /* We checked the operand during insn creation -- skip va_arg type  */
      }
      if (code == MIR_SWITCH) {
        out_p = FALSE;
        expected_mode = i == 0 ? MIR_OP_INT : MIR_OP_LABEL;
      } else if (code == MIR_RET) {
        out_p = FALSE;
        expected_mode = type2mode (curr_func->res_types[i]);
      } else {
        expected_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
      }
      can_be_out_p = TRUE;
      switch (insn->ops[i].mode) {
      case MIR_OP_REG:
        rd = find_rd_by_reg (ctx, insn->ops[i].u.reg, curr_func);
        mir_assert (rd != NULL && insn->ops[i].u.reg == rd->reg);
        mode = type2mode (rd->type);
        break;
      case MIR_OP_MEM:
        expr_p = FALSE;
        if (wrong_type_p (insn->ops[i].u.mem.type)
            && (!MIR_all_blk_type_p (insn->ops[i].u.mem.type) || !MIR_call_code_p (code))) {
          curr_func = NULL;
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "func %s: in instruction '%s': wrong type memory", func_name,
                                    insn_descs[code].name);
        }
        if (MIR_all_blk_type_p (insn->ops[i].u.mem.type) && insn->ops[i].u.mem.disp < 0) {
          curr_func = NULL;
          MIR_get_error_func (ctx) (MIR_wrong_type_error,
                                    "func %s: in instruction '%s': block type memory with disp < 0",
                                    func_name, insn_descs[code].name);
        }
        if (insn->ops[i].u.mem.base != 0) {
          rd = find_rd_by_reg (ctx, insn->ops[i].u.mem.base, curr_func);
          mir_assert (rd != NULL && insn->ops[i].u.mem.base == rd->reg);
          if (type2mode (rd->type) != MIR_OP_INT) {
            curr_func = NULL;
            MIR_get_error_func (
              ctx) (MIR_reg_type_error,
                    "func %s: in instruction '%s': base reg of non-integer type for operand "
                    "#%d",
                    func_name, insn_descs[code].name, i + 1);
          }
        }
        if (insn->ops[i].u.mem.index != 0) {
          rd = find_rd_by_reg (ctx, insn->ops[i].u.mem.index, curr_func);
          mir_assert (rd != NULL && insn->ops[i].u.mem.index == rd->reg);
          if (type2mode (rd->type) != MIR_OP_INT) {
            curr_func = NULL;
            MIR_get_error_func (
              ctx) (MIR_reg_type_error,
                    "func %s: in instruction '%s': index reg of non-integer type for "
                    "operand #%d",
                    func_name, insn_descs[code].name, i + 1);
          }
        }
        mode = type2mode (insn->ops[i].u.mem.type);
        break;
      case MIR_OP_VAR:
      case MIR_OP_VAR_MEM:
        expr_p = FALSE;
        mode = expected_mode;
        mir_assert (FALSE); /* Should not be here */
        break;
      default:
        can_be_out_p = FALSE;
        mode = insn->ops[i].mode;
        if (mode == MIR_OP_REF || mode == MIR_OP_STR) mode = MIR_OP_INT; /* just an address */
        break;
      }
      insn->ops[i].value_mode = mode;
      if (mode == MIR_OP_UNDEF && insn->ops[i].mode == MIR_OP_MEM
          && ((code == MIR_VA_START && i == 0)
              || ((code == MIR_VA_ARG || code == MIR_VA_BLOCK_ARG) && i == 1)
              || (code == MIR_VA_END && i == 1))) { /* a special case: va_list as undef type mem */
        insn->ops[i].value_mode = expected_mode;
      } else if (expected_mode == MIR_OP_REG) {
        if (insn->ops[i].mode != MIR_OP_REG && insn->ops[i].mode != MIR_OP_VAR)
          MIR_get_error_func (
            ctx) (MIR_op_mode_error,
                  "func %s: in instruction '%s': expected reg for operand #%d. Got '%s'", func_name,
                  insn_descs[code].name, i + 1, mode_str (insn->ops[i].mode));
      } else if (expected_mode != MIR_OP_UNDEF
                 && (mode == MIR_OP_UINT ? MIR_OP_INT : mode) != expected_mode) {
        curr_func = NULL;
        MIR_get_error_func (
          ctx) (MIR_op_mode_error,
                "func %s: in instruction '%s': unexpected operand mode for operand #%d. Got "
                "'%s', expected '%s'",
                func_name, insn_descs[code].name, i + 1, mode_str (mode), mode_str (expected_mode));
      }
      if (out_p && !can_be_out_p) {
        curr_func = NULL;
        MIR_get_error_func (ctx) (MIR_out_op_error,
                                  "func %s; in instruction '%s': wrong operand #%d for insn output",
                                  func_name, insn_descs[code].name, i + 1);
      }
    }
  }
  if (!ret_p && !jret_p
      && ((insn = DLIST_TAIL (MIR_insn_t, curr_func->insns)) == NULL || insn->code != MIR_JMP)) {
    VARR_TRUNC (MIR_op_t, temp_ops, 0);
    for (size_t i = 0; i < curr_func->nres; i++) { /* add absent ret */
      MIR_op_t op;
      if (curr_func->res_types[i] == MIR_T_F)
        op = MIR_new_float_op (ctx, 0.0f);
      else if (curr_func->res_types[i] == MIR_T_D)
        op = MIR_new_double_op (ctx, 0.0);
      else if (curr_func->res_types[i] == MIR_T_LD)
        op = MIR_new_ldouble_op (ctx, 0.0);
      else
        op = MIR_new_int_op (ctx, 0);
      VARR_PUSH (MIR_op_t, temp_ops, op);
    }
    MIR_append_insn (ctx, curr_func->func_item,
                     MIR_new_insn_arr (ctx, MIR_RET, curr_func->nres,
                                       VARR_ADDR (MIR_op_t, temp_ops)));
  }
  curr_func->expr_p = expr_p;
  curr_func->jret_p = jret_p;
  curr_func = NULL;
}